

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O3

void __thiscall HenyeyGreenstein_Normalized_Test::TestBody(HenyeyGreenstein_Normalized_Test *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *message;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  float fVar16;
  float fVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  Stratified2DIter __begin2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff50;
  float __x;
  Stratified2DIter local_88;
  undefined1 local_68 [16];
  AssertHelper local_50;
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  fVar16 = -0.75;
  uVar4 = 0x853c49e6748fea9b;
  do {
    uVar5 = uVar4 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar4;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar5;
    auVar14 = vpunpcklqdq_avx(auVar19,auVar8);
    auVar7 = vpsrlvq_avx2(auVar14,_DAT_006015b0);
    auVar8 = vpsrlvq_avx2(auVar14,_DAT_006015a0);
    auVar14 = vpsrlq_avx(auVar14,0x3b);
    auVar14 = vpshufd_avx(auVar14,0xe8);
    uVar4 = uVar5 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    auVar7 = vpshufd_avx(auVar8 ^ auVar7,0xe8);
    auVar14 = vprorvd_avx512vl(auVar7,auVar14);
    auVar7 = vcvtudq2ps_avx512vl(auVar14);
    auVar14._8_4_ = 0x2f800000;
    auVar14._0_8_ = 0x2f8000002f800000;
    auVar14._12_4_ = 0x2f800000;
    auVar8 = vmulps_avx512vl(auVar7,auVar14);
    auVar7._8_4_ = 0x3f7fffff;
    auVar7._0_8_ = 0x3f7fffff3f7fffff;
    auVar7._12_4_ = 0x3f7fffff;
    uVar5 = vcmpps_avx512vl(auVar8,auVar7,1);
    auVar14 = vmovshdup_avx(auVar8);
    bVar1 = (byte)(uVar5 >> 1);
    local_48 = vfmadd132ss_fma(ZEXT416((uint)(bVar1 & 1) * auVar14._0_4_ +
                                       (uint)!(bool)(bVar1 & 1) * 0x3f7fffff),
                               SUB6416(ZEXT464(0x3f800000),0),SUB6416(ZEXT464(0xc0000000),0));
    auVar14 = vfnmadd213ss_fma(local_48,local_48,SUB6416(ZEXT464(0x3f800000),0));
    auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x20);
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar17 = auVar14._0_4_;
    fVar6 = (float)((uint)((byte)uVar5 & 1) * (int)(auVar8._0_4_ * 6.2831855) +
                   (uint)!(bool)((byte)uVar5 & 1) * 0x40c90fda);
    local_68 = ZEXT416((uint)fVar6);
    fVar9 = cosf(fVar6);
    fVar9 = fVar9 * fVar17;
    fVar10 = sinf((float)local_68._0_4_);
    fVar10 = fVar10 * fVar17;
    local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
    super_IndexingIterator<pbrt::detail::Stratified2DIter>.i = 0;
    local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
    super_IndexingIterator<pbrt::detail::Stratified2DIter>.n = 0x1000;
    local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng.inc = 1;
    local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng.state =
         (uint64_t)&DAT_5851f42d4c957f2e;
    local_88.nx = 0x40;
    local_88.ny = 0x40;
    auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),
                              SUB6416(ZEXT464(0x3f800000),0));
    uVar11 = auVar14._0_4_;
    fVar6 = fVar16 + fVar16;
    auVar14 = vfnmadd213ss_fma(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),
                               SUB6416(ZEXT464(0x3f800000),0));
    fVar17 = 0.0;
    do {
      auVar15._0_8_ = pbrt::detail::Stratified2DIter::operator*(&local_88);
      auVar15._8_56_ = extraout_var;
      auVar7 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar15._0_16_,ZEXT416(0xc0000000));
      uVar18 = auVar7._0_4_;
      auVar7 = vfnmadd213ss_fma(auVar7,auVar7,SUB6416(ZEXT464(0x3f800000),0));
      auVar7 = vmaxss_avx(auVar7,ZEXT816(0));
      auVar8 = vsqrtss_avx(auVar7,auVar7);
      auVar7 = vmovshdup_avx(auVar15._0_16_);
      __x = auVar7._0_4_ * 6.2831855;
      local_68._0_4_ = auVar8._0_4_;
      fVar12 = cosf(__x);
      fVar12 = fVar12 * (float)local_68._0_4_;
      fVar13 = sinf(__x);
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (float)local_68._0_4_ * fVar10)),
                               ZEXT416((uint)fVar12),ZEXT416((uint)fVar9));
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416(uVar18),ZEXT416((uint)local_48._0_4_));
      auVar8 = vfmadd213ss_fma(auVar7,ZEXT416((uint)fVar6),ZEXT416(uVar11));
      auVar7 = vmaxss_avx(auVar8,ZEXT416(0));
      iVar3 = local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
              super_IndexingIterator<pbrt::detail::Stratified2DIter>.i + 1;
      local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
      super_IndexingIterator<pbrt::detail::Stratified2DIter>.i = iVar3;
      auVar7 = vsqrtss_avx(auVar7,auVar7);
      fVar17 = fVar17 + (auVar14._0_4_ * 0.07957747) / (auVar8._0_4_ * auVar7._0_4_);
    } while (iVar3 != 0x1000);
    testing::internal::DoubleNearPredFormat
              ((char *)in_stack_ffffffffffffff50.ptr_,(char *)CONCAT44(fVar16,fVar17),
               (char *)0x2d10b2,(double)CONCAT44(uVar18,fVar12),(double)CONCAT44(__x,fVar9),
               (double)CONCAT44(fVar10,uVar11));
    if ((char)local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.
              super_IndexingIterator<pbrt::detail::Stratified2DIter>.i == '\0') {
      testing::Message::Message((Message *)&stack0xffffffffffffff50);
      message = "";
      if ((undefined8 *)local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng.state !=
          (undefined8 *)0x0) {
        message = *(char **)local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng.state;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media_test.cpp"
                 ,0x4e,message);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&stack0xffffffffffffff50);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (in_stack_ffffffffffffff50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (in_stack_ffffffffffffff50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)in_stack_ffffffffffffff50.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88.super_RNGIterator<pbrt::detail::Stratified2DIter>.rng,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    fVar16 = fVar16 + 0.25;
  } while (fVar16 <= 0.75);
  return;
}

Assistant:

TEST(HenyeyGreenstein, Normalized) {
    RNG rng;
    for (float g = -.75; g <= 0.75; g += 0.25) {
        HGPhaseFunction hg(g);
        Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Float sum = 0;
        int sqrtSamples = 64;
        int nSamples = sqrtSamples * sqrtSamples;
        for (Point2f u : Stratified2D(sqrtSamples, sqrtSamples)) {
            Vector3f wi = SampleUniformSphere(u);
            sum += hg.p(wo, wi);
        }
        // Phase function should integrate to 1/4pi.
        EXPECT_NEAR(sum / nSamples, 1. / (4. * Pi), 1e-3f);
    }
}